

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void hit_trap(loc_conflict grid,wchar_t delayed)

{
  effect *peVar1;
  loc_conflict grid1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  trap *ptVar6;
  trap *ptVar7;
  source sVar8;
  source origin;
  source origin_00;
  wchar_t target_place;
  wchar_t local_34;
  _Bool saved;
  wchar_t flag;
  effect *effect;
  trap *next_trap;
  trap *trap;
  _Bool ident;
  loc_conflict lStack_10;
  wchar_t delayed_local;
  loc_conflict grid_local;
  
  trap._3_1_ = 0;
  trap._4_4_ = delayed;
  lStack_10 = grid;
  ptVar6 = square_trap((chunk *)cave,grid);
  do {
    while( true ) {
      do {
        next_trap = ptVar6;
        if (next_trap == (trap *)0x0) goto LAB_00225e84;
        bVar2 = false;
        ptVar6 = next_trap->next;
        _Var3 = flag_has_dbg(next_trap->kind->flags,3,2,"trap->kind->flags","TRF_TRAP");
        wVar4 = trap._4_4_;
      } while (((!_Var3) || (next_trap->timeout != '\0')) ||
              ((_Var3 = flag_has_dbg(next_trap->kind->flags,3,0xe,"trap->kind->flags","TRF_DELAY"),
               wVar4 != (uint)_Var3 && (trap._4_4_ != L'\xffffffff'))));
      _Var3 = player_is_trapsafe(player);
      if (!_Var3) break;
      _Var3 = player_of_has(player,L'(');
      if (_Var3) {
        equip_learn_flag(player,L'(');
      }
      flag_on_dbg(next_trap->flags,3,3,"trap->flags","TRF_VISIBLE");
    }
    disturb(player);
    if (next_trap->kind->msg != (char *)0x0) {
      msg("%s",next_trap->kind->msg);
    }
    for (local_34 = flag_next(next_trap->kind->save_flags,6,1); local_34 != L'\0';
        local_34 = flag_next(next_trap->kind->save_flags,6,local_34 + L'\x01')) {
      _Var3 = player_of_has(player,local_34);
      if (_Var3) {
        bVar2 = true;
        equip_learn_flag(player,local_34);
      }
    }
    _Var3 = flag_has_dbg(next_trap->kind->flags,3,0xc,"trap->kind->flags","TRF_SAVE_ARMOR");
    if ((_Var3) && (_Var3 = check_hit(player,L'}'), !_Var3)) {
      bVar2 = true;
    }
    _Var3 = flag_has_dbg(next_trap->kind->flags,3,0xb,"trap->kind->flags","TRF_SAVE_THROW");
    if ((_Var3) && (wVar4 = Rand_div(100), wVar4 < (player->state).skills[3])) {
      bVar2 = true;
    }
    if (bVar2) {
      if (next_trap->kind->msg_good != (char *)0x0) {
        msg("%s",next_trap->kind->msg_good);
      }
    }
    else {
      if (next_trap->kind->msg_bad != (char *)0x0) {
        msg("%s",next_trap->kind->msg_bad);
      }
      peVar1 = next_trap->kind->effect;
      sVar8 = source_trap(next_trap);
      origin.which = sVar8.which;
      origin._4_4_ = 0;
      origin.what = sVar8.what;
      effect_do(peVar1,origin,(object *)0x0,(_Bool *)((long)&trap + 3),false,L'\0',L'\0',L'\0',
                (command_conflict *)0x0);
      ptVar7 = square_trap((chunk *)cave,lStack_10);
      if ((ptVar7 == (trap *)0x0) || ((player->is_dead & 1U) != 0)) {
LAB_00225e84:
        square_memorize_traps((chunk_conflict2 *)cave,lStack_10);
        _Var3 = square_isseen((chunk *)cave,lStack_10);
        if (_Var3) {
          square_light_spot((chunk *)cave,(loc)lStack_10);
        }
        return;
      }
      if ((next_trap->kind->effect_xtra != (effect *)0x0) && (uVar5 = Rand_div(2), uVar5 == 0)) {
        if (next_trap->kind->msg_xtra != (char *)0x0) {
          msg("%s",next_trap->kind->msg_xtra);
        }
        peVar1 = next_trap->kind->effect_xtra;
        sVar8 = source_trap(next_trap);
        origin_00.which = sVar8.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar8.what;
        effect_do(peVar1,origin_00,(object *)0x0,(_Bool *)((long)&trap + 3),false,L'\0',L'\0',L'\0',
                  (command_conflict *)0x0);
        ptVar7 = square_trap((chunk *)cave,lStack_10);
        if ((ptVar7 == (trap *)0x0) || ((player->is_dead & 1U) != 0)) goto LAB_00225e84;
      }
    }
    _Var3 = flag_has_dbg(next_trap->kind->flags,3,7,"trap->kind->flags","TRF_DOWN");
    if (_Var3) {
      wVar4 = player_get_next_place((int)player->place,"down",L'\x01');
      player_change_place(player,wVar4);
    }
    _Var3 = flag_has_dbg(next_trap->kind->flags,3,8,"trap->kind->flags","TRF_PIT");
    if ((_Var3) && (_Var3 = loc_eq(player->grid,(loc)next_trap->grid), !_Var3)) {
      grid1.x = (player->grid).x;
      grid1.y = (player->grid).y;
      monster_swap(grid1,next_trap->grid);
      player_handle_post_move(player,false,true);
    }
    _Var3 = flag_has_dbg(next_trap->kind->flags,3,9,"trap->kind->flags","TRF_ONETIME");
    if ((_Var3) || (uVar5 = Rand_div(3), uVar5 == 0)) {
      _Var3 = square_remove_trap((chunk_conflict2 *)cave,lStack_10,next_trap,false);
      if (!_Var3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                      ,0x270,"void hit_trap(struct loc, int)");
      }
    }
    else {
      flag_on_dbg(next_trap->flags,3,3,"trap->flags","TRF_VISIBLE");
    }
  } while( true );
}

Assistant:

extern void hit_trap(struct loc grid, int delayed)
{
	bool ident = false;
	struct trap *trap, *next_trap;
	struct effect *effect;

	/* Look at the traps in this grid */
	for (trap = square_trap(cave, grid); trap; trap = next_trap) {
		int flag;
		bool saved = false;

		next_trap = trap->next;

		/* Require that trap be capable of affecting the character */
		if (!trf_has(trap->kind->flags, TRF_TRAP)) continue;
		if (trap->timeout) continue;

		if (delayed != trf_has(trap->kind->flags, TRF_DELAY) &&
		    delayed != -1)
			continue;

		if (player_is_trapsafe(player)) {
			/* Trap immune player learns the rune */
			if (player_of_has(player, OF_TRAP_IMMUNE)) {
				equip_learn_flag(player, OF_TRAP_IMMUNE);
			}
			/* Trap becomes visible. */
			trf_on(trap->flags, TRF_VISIBLE);
			continue;
		}

		/* Disturb the player */
		disturb(player);

		/* Give a message */
		if (trap->kind->msg)
			msg("%s", trap->kind->msg);

		/* Test for save due to flag */
		for (flag = of_next(trap->kind->save_flags, FLAG_START);
			 flag != FLAG_END;
			 flag = of_next(trap->kind->save_flags, flag + 1))
			if (player_of_has(player, flag)) {
				saved = true;
				equip_learn_flag(player, flag);
			}

		/* Test for save due to armor */
		if (trf_has(trap->kind->flags, TRF_SAVE_ARMOR)
			&& !check_hit(player, 125))
			saved = true;

		/* Test for save due to saving throw */
		if (trf_has(trap->kind->flags, TRF_SAVE_THROW) &&
			(randint0(100) < player->state.skills[SKILL_SAVE]))
			saved = true;

		/* Save, or fire off the trap */
		if (saved) {
			if (trap->kind->msg_good)
				msg("%s", trap->kind->msg_good);
		} else {
			if (trap->kind->msg_bad)
				msg("%s", trap->kind->msg_bad);
			effect = trap->kind->effect;
			effect_do(effect, source_trap(trap), NULL, &ident, false, 0, 0, 0, NULL);

			/* Trap may have gone or the player may be dead */
			if (!square_trap(cave, grid) || player->is_dead) break;

			/* Do any extra effects */
			if (trap->kind->effect_xtra && one_in_(2)) {
				if (trap->kind->msg_xtra)
					msg("%s", trap->kind->msg_xtra);
				effect = trap->kind->effect_xtra;
				effect_do(effect, source_trap(trap), NULL, &ident, false,
						  0, 0, 0, NULL);

				/* Trap may have gone or the player may be dead */
				if (!square_trap(cave, grid) || player->is_dead) break;
			}
		}

		/* Some traps drop you a dungeon level */
		if (trf_has(trap->kind->flags, TRF_DOWN)) {
			int target_place = player_get_next_place(player->place, "down", 1);
			player_change_place(player,	target_place);
		}

		/* Some traps drop you onto them */
		if (trf_has(trap->kind->flags, TRF_PIT)
				&& !loc_eq(player->grid, trap->grid)) {
			monster_swap(player->grid, trap->grid);
			/*
			 * Don't retrigger the trap, but handle the
			 * other side effects of an involuntary move of the
			 * player.
			 */
			player_handle_post_move(player, false, true);
		}

		/* Some traps disappear after activating, all have a chance to */
		if (trf_has(trap->kind->flags, TRF_ONETIME) || one_in_(3)) {
			if (!square_remove_trap(cave, grid, trap, false)) {
				assert(0);
			}
		} else {
			/* Trap becomes visible */
			trf_on(trap->flags, TRF_VISIBLE);
		}
	}

	/* Update the player's view. */
	square_memorize_traps(cave, grid);
	if (square_isseen(cave, grid)) {
		square_light_spot(cave, grid);
	}
}